

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgridlayout.cpp
# Opt level: O2

void __thiscall
QGridLayout::addItem
          (QGridLayout *this,QLayoutItem *item,int row,int column,int rowSpan,int columnSpan,
          Alignment alignment)

{
  QGridLayoutPrivate *this_00;
  QGridBox *this_01;
  int row2;
  int col2;
  
  this_00 = *(QGridLayoutPrivate **)&(this->super_QLayout).field_0x8;
  this_01 = (QGridBox *)operator_new(0x18);
  this_01->item_ = item;
  QGridBox::setAlignment(this_01,alignment);
  row2 = row + rowSpan + -1;
  if (rowSpan < 0) {
    row2 = -1;
  }
  col2 = column + columnSpan + -1;
  if (columnSpan < 0) {
    col2 = -1;
  }
  QGridLayoutPrivate::add(this_00,this_01,row,row2,column,col2);
  (**(code **)(*(long *)&this->super_QLayout + 0x70))(this);
  return;
}

Assistant:

void QGridLayout::addItem(QLayoutItem *item, int row, int column, int rowSpan, int columnSpan, Qt::Alignment alignment)
{
    Q_D(QGridLayout);
    QGridBox *b = new QGridBox(item);
    b->setAlignment(alignment);
    d->add(b, row, (rowSpan < 0) ? -1 : row + rowSpan - 1, column, (columnSpan < 0) ? -1 : column + columnSpan - 1);
    invalidate();
}